

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
tcu::operator+(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  int col;
  long lVar1;
  long lVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      VVar3.m_data[0] =
           ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)a)->m_data)->m_data[0].m_data
           [lVar2] + ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)b)->m_data)->m_data
                     [0].m_data[lVar2];
      VVar3.m_data[1] = 0.0;
      *(float *)(this + lVar2 * 4) = VVar3.m_data[0];
    }
    this = this + 8;
    b = (Matrix<float,_2,_2> *)((long)b + 8);
    a = (Matrix<float,_2,_2> *)((long)a + 8);
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) + b(row, col);
	return res;
}